

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall leveldb::Arena::~Arena(Arena *this)

{
  long lVar1;
  pointer ppcVar2;
  char *pcVar3;
  size_t i;
  ulong uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0;
  while( true ) {
    ppcVar2 = (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppcVar2 >> 3) <= uVar4) break;
    pcVar3 = ppcVar2[uVar4];
    if (pcVar3 != (char *)0x0) {
      operator_delete__(pcVar3);
    }
    uVar4 = uVar4 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
              (&(this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>);
    return;
  }
  __stack_chk_fail();
}

Assistant:

Arena::~Arena() {
  for (size_t i = 0; i < blocks_.size(); i++) {
    delete[] blocks_[i];
  }
}